

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O1

ssize_t __thiscall
capnp::_::anon_unknown_0::TestNetworkAdapter::ConnectionImpl::OutgoingRpcMessageImpl::send
          (OutgoingRpcMessageImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uint *puVar1;
  TaskSet *this_00;
  ArrayPtr<const_capnp::word> array;
  word *pwVar2;
  size_t sVar3;
  Disposer *pDVar4;
  PromiseNode *pPVar5;
  int iVar6;
  PromiseNode *pPVar7;
  TransformPromiseNodeBase *this_01;
  ConnectionImpl *extraout_RAX;
  undefined4 extraout_var;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar9;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  ReaderOptions options;
  Array<capnp::word> local_68;
  Own<kj::_::PromiseNode> local_48;
  ArrayDisposer *local_38;
  ConnectionImpl *pCVar8;
  
  pCVar8 = this->connection;
  if ((pCVar8->networkException).ptr.isSet == false) {
    puVar1 = &pCVar8->network->sent;
    *puVar1 = *puVar1 + 1;
    AVar9 = MessageBuilder::getSegmentsForOutput(&(this->message).super_MessageBuilder);
    segments.ptr = (ArrayPtr<const_capnp::word> *)AVar9.size_;
    segments.size_ = __n;
    messageToFlatArray(&local_68,(capnp *)AVar9.ptr,segments);
    pPVar7 = (PromiseNode *)operator_new(0x138);
    sVar3 = local_68.size_;
    pwVar2 = local_68.ptr;
    array.size_ = local_68.size_;
    array.ptr = local_68.ptr;
    local_38 = local_68.disposer;
    local_68.ptr = (word *)0x0;
    local_68.size_ = 0;
    *(undefined4 *)&pPVar7[2]._vptr_PromiseNode = 0;
    pPVar7->_vptr_PromiseNode = (_func_int **)&PTR_getBody_00631060;
    pPVar7[1]._vptr_PromiseNode = (_func_int **)&PTR_disposeImpl_00631088;
    pPVar7[3]._vptr_PromiseNode = (_func_int **)pwVar2;
    pPVar7[4]._vptr_PromiseNode = (_func_int **)sVar3;
    pPVar7[5]._vptr_PromiseNode = (_func_int **)local_68.disposer;
    local_48.disposer = (Disposer *)0x0;
    local_48.ptr = (PromiseNode *)0x0;
    options._8_8_ = 0x40;
    options.traversalLimitInWords = 0x800000;
    UnalignedFlatArrayMessageReader::UnalignedFlatArrayMessageReader
              ((UnalignedFlatArrayMessageReader *)(pPVar7 + 6),array,options);
    pPVar5 = local_48.ptr;
    pDVar4 = local_48.disposer;
    (((UnalignedFlatArrayMessageReader *)(pPVar7 + 6))->super_MessageReader)._vptr_MessageReader =
         (_func_int **)&PTR__UnalignedFlatArrayMessageReader_006334a8;
    if (local_48.disposer != (Disposer *)0x0) {
      local_48.disposer = (Disposer *)0x0;
      local_48.ptr = (PromiseNode *)0x0;
      (**local_38->_vptr_ArrayDisposer)(local_38,pDVar4,8,pPVar5,pPVar5,0);
    }
    sVar3 = local_68.size_;
    pwVar2 = local_68.ptr;
    if (local_68.ptr != (word *)0x0) {
      local_68.ptr = (word *)0x0;
      local_68.size_ = 0;
      (**(local_68.disposer)->_vptr_ArrayDisposer)(local_68.disposer,pwVar2,8,sVar3,sVar3,0);
    }
    pCVar8 = this->connection;
    this_00 = (pCVar8->tasks).ptr;
    kj::_::yield();
    this_01 = (TransformPromiseNodeBase *)operator_new(0x40);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_01,&local_48,
               kj::
               CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:280:13),_kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>_>
               ::operator()<>);
    pPVar5 = local_48.ptr;
    (this_01->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00631120;
    this_01[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)pCVar8;
    this_01[1].dependency.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>
          ::instance;
    this_01[1].dependency.ptr = pPVar7;
    local_68.ptr = (word *)&kj::_::
                            HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::CaptureByMove<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::OutgoingRpcMessageImpl::send()::{lambda(kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>&&)#1},kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>>,kj::_::PropagateException>>
                            ::instance;
    local_68.size_ = (size_t)this_01;
    if (local_48.ptr != (PromiseNode *)0x0) {
      local_48.ptr = (PromiseNode *)0x0;
      (**(local_48.disposer)->_vptr_Disposer)
                (local_48.disposer,pPVar5->_vptr_PromiseNode[-2] + (long)&pPVar5->_vptr_PromiseNode)
      ;
    }
    kj::TaskSet::add(this_00,(Promise<void> *)&local_68);
    sVar3 = local_68.size_;
    pCVar8 = extraout_RAX;
    if ((TransformPromiseNodeBase *)local_68.size_ != (TransformPromiseNodeBase *)0x0) {
      local_68.size_ = 0;
      iVar6 = (**(code **)(local_68.ptr)->content)
                        (local_68.ptr,
                         ((PromiseNode *)sVar3)->_vptr_PromiseNode[-2] +
                         (long)&((PromiseNode *)sVar3)->_vptr_PromiseNode);
      pCVar8 = (ConnectionImpl *)CONCAT44(extraout_var,iVar6);
    }
  }
  return (ssize_t)pCVar8;
}

Assistant:

void send() override {
        if (connection.networkException != nullptr) {
          return;
        }

        ++connection.network.sent;

        // Uncomment to get a debug dump.
//        kj::String msg = connection.network.network.dumper.dump(
//            message.getRoot<rpc::Message>(), connection.sender);
//        KJ_ DBG(msg);

        auto incomingMessage = kj::heap<IncomingRpcMessageImpl>(messageToFlatArray(message));

        auto connectionPtr = &connection;
        connection.tasks->add(kj::evalLater(kj::mvCapture(incomingMessage,
            [connectionPtr](kj::Own<IncomingRpcMessageImpl>&& message) {
          KJ_IF_MAYBE(p, connectionPtr->partner) {
            if (p->fulfillers.empty()) {
              p->messages.push(kj::mv(message));
            } else {
              ++p->network.received;
              p->fulfillers.front()->fulfill(
                  kj::Own<IncomingRpcMessage>(kj::mv(message)));
              p->fulfillers.pop();
            }
          }
        })));
      }